

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBSepiaRow_C(uint8_t *dst_argb,int width)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int32_t iVar4;
  int in_ESI;
  byte *in_RDI;
  int sr;
  int sg;
  int sb;
  int r;
  int g;
  int b;
  int x;
  int local_10;
  byte *local_8;
  
  local_8 = in_RDI;
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    uVar1 = (uint)*local_8;
    uVar2 = (uint)local_8[1];
    uVar3 = (uint)local_8[2];
    *local_8 = (byte)((int)(uVar1 * 0x11 + uVar2 * 0x44 + uVar3 * 0x23) >> 7);
    iVar4 = libyuv::clamp255((int)(uVar1 * 0x16 + uVar2 * 0x58 + uVar3 * 0x2d) >> 7);
    local_8[1] = (byte)iVar4;
    iVar4 = libyuv::clamp255((int)(uVar1 * 0x18 + uVar2 * 0x62 + uVar3 * 0x32) >> 7);
    local_8[2] = (byte)iVar4;
    local_8 = local_8 + 4;
  }
  return;
}

Assistant:

void ARGBSepiaRow_C(uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = dst_argb[0];
    int g = dst_argb[1];
    int r = dst_argb[2];
    int sb = (b * 17 + g * 68 + r * 35) >> 7;
    int sg = (b * 22 + g * 88 + r * 45) >> 7;
    int sr = (b * 24 + g * 98 + r * 50) >> 7;
    // b does not over flow. a is preserved from original.
    dst_argb[0] = sb;
    dst_argb[1] = clamp255(sg);
    dst_argb[2] = clamp255(sr);
    dst_argb += 4;
  }
}